

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O0

void decode_alBufferfv(void)

{
  uint32 name_00;
  ALenum param_00;
  uint32 numvals_00;
  int32 iVar1;
  ALfloat *origvalues_00;
  ALfloat *values_00;
  uint local_254;
  uint32 i;
  ALfloat *values;
  uint32 numvals;
  ALfloat *origvalues;
  ALenum param;
  ALuint name;
  CallerInfo callerinfo;
  
  IO_ENTRYINFO((CallerInfo *)&param);
  if (io_failure == 0) {
    name_00 = IO_UINT32();
    param_00 = IO_ENUM();
    origvalues_00 = (ALfloat *)IO_PTR();
    numvals_00 = IO_UINT32();
    values_00 = (ALfloat *)get_ioblob((ulong)numvals_00 << 2);
    for (local_254 = 0; local_254 < numvals_00; local_254 = local_254 + 1) {
      iVar1 = IO_INT32();
      values_00[local_254] = (float)iVar1;
    }
    if (io_failure == 0) {
      visit_alBufferfv((CallerInfo *)&param,name_00,param_00,origvalues_00,numvals_00,values_00);
    }
  }
  return;
}

Assistant:

static void decode_alBufferfv(void)
{
    IO_START(alBufferfv);
    const ALuint name = IO_UINT32();
    const ALenum param = IO_ENUM();
    const ALfloat *origvalues = (ALfloat *) IO_PTR();
    const uint32 numvals = IO_UINT32();
    ALfloat *values = (ALfloat *) get_ioblob(sizeof (ALfloat) * numvals);
    uint32 i;

    for (i = 0; i < numvals; i++) {
        values[i] = IO_INT32();
    }

    if (!io_failure) visit_alBufferfv(&callerinfo, name, param, origvalues, numvals, values);

    IO_END();
}